

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

void * lzham::lzham_malloc(lzham_malloc_context context,size_t size,size_t *pActual_size)

{
  ulong *in_RDX;
  long in_RSI;
  malloc_context *in_RDI;
  malloc_context *pContext;
  uint8 *p_new;
  size_t actual_size;
  uint in_stack_000001c4;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  char *in_stack_ffffffffffffffc8;
  malloc_context *this;
  lzham_malloc_context in_stack_ffffffffffffffd0;
  ulong local_28;
  ulong *local_20;
  ulong local_18;
  malloc_context *local_10;
  void *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI == (malloc_context *)0x0) {
    lzham_assert(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
  }
  local_18 = local_18 + 3 & 0xfffffffffffffffc;
  if (local_18 == 0) {
    local_18 = 4;
  }
  if (local_18 < 0x400000001) {
    local_28 = local_18;
    this = local_10;
    if (local_10->m_sig != 0x5749abcd) {
      lzham_assert(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
      this = local_10;
    }
    local_8 = malloc_context::arena_alloc(this,local_18);
    if (local_8 == (void *)0x0) {
      local_8 = (void *)(*(code *)g_pRealloc)(0,local_18,&local_28,1,g_pUser_data);
    }
    if (local_20 != (ulong *)0x0) {
      *local_20 = local_28;
    }
    if ((local_8 == (lzham_malloc_context)0x0) || (local_28 < local_18)) {
      lzham_mem_error(local_8,(char *)this);
      local_8 = (void *)0x0;
    }
  }
  else {
    lzham_mem_error(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void* lzham_malloc(lzham_malloc_context context, size_t size, size_t* pActual_size)
   {
      LZHAM_VERIFY(context);
      
      size = (size + sizeof(uint32) - 1U) & ~(sizeof(uint32) - 1U);
      if (!size)
         size = sizeof(uint32);

      if (size > MAX_POSSIBLE_BLOCK_SIZE)
      {
         lzham_mem_error(context, "lzham_malloc: size too big");
         return NULL;
      }

      size_t actual_size = size;
      uint8* p_new;

      malloc_context *pContext = static_cast<malloc_context *>(context);

      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

      p_new = static_cast<uint8 *>(pContext->arena_alloc(size));
      if (!p_new)
      {
         p_new = static_cast<uint8*>((*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data));
      }

      if (pActual_size)
         *pActual_size = actual_size;

      if ((!p_new) || (actual_size < size))
      {
         lzham_mem_error(context, "lzham_malloc: out of memory");
         return NULL;
      }

      LZHAM_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if LZHAM_MEM_STATS
      pContext->update_total_allocated(1, static_cast<int64>(actual_size));
#endif

      return p_new;
   }